

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SizedPtr __thiscall
google::protobuf::internal::SerialArena::
Free<google::protobuf::internal::(anonymous_namespace)::GetDeallocator>
          (SerialArena *this,GetDeallocator deallocator)

{
  StringBlock *string_block;
  __pointer_type pAVar1;
  size_t sVar2;
  __pointer_type pAVar3;
  SizedPtr SVar4;
  
  string_block = (this->string_block_)._M_b._M_p;
  if (string_block != (StringBlock *)0x0) {
    FreeStringBlocks(string_block,
                     (this->string_block_unused_).super___atomic_base<unsigned_long>._M_i);
  }
  pAVar1 = (this->head_)._M_b._M_p;
  sVar2 = pAVar1->size;
  for (pAVar3 = pAVar1->next; pAVar3 != (__pointer_type)0x0; pAVar3 = pAVar3->next) {
    if (deallocator.dealloc_ == (_func_void_void_ptr_size_t *)0x0) {
      operator_delete(pAVar1,sVar2);
    }
    else {
      (*deallocator.dealloc_)(pAVar1,sVar2);
    }
    sVar2 = pAVar3->size;
    pAVar1 = pAVar3;
  }
  SVar4.n = sVar2;
  SVar4.p = pAVar1;
  return SVar4;
}

Assistant:

SizedPtr SerialArena::Free(Deallocator deallocator) {
  FreeStringBlocks();

  ArenaBlock* b = head();
  SizedPtr mem = {b, b->size};
  while (b->next) {
    b = b->next;  // We must first advance before deleting this block
    deallocator(mem);
    mem = {b, b->size};
  }
  return mem;
}